

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,char *filename,REF_BOOL swap,REF_BOOL fat)

{
  int iVar1;
  REF_NODE ref_node;
  uint uVar2;
  REF_STATUS RVar3;
  REF_STATUS RVar4;
  FILE *__s;
  size_t sVar5;
  REF_INT RVar6;
  int iVar7;
  long lVar8;
  REF_CELL pRVar9;
  ulong uVar10;
  REF_CELL *ppRVar11;
  REF_DBL swapped_dbl;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT nodes [27];
  ulong local_f8;
  ulong local_f0;
  REF_DBL local_e0;
  ulong local_d8;
  REF_CELL local_d0;
  REF_INT *local_c8;
  REF_INT *local_c0;
  long local_b8;
  int local_b0;
  uint local_ac;
  REF_INT local_a8 [4];
  REF_INT local_98;
  
  ref_node = ref_grid->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x62d,
           "ref_export_bin_ugrid","unable to open file");
    uVar2 = 2;
  }
  else {
    uVar2 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_node->n);
    if (uVar2 == 0) {
      RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[3]->n);
      if (RVar3 == 0) {
        RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[6]->n);
        if (RVar3 == 0) {
          RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[8]->n);
          if (RVar3 == 0) {
            RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[9]->n);
            if (RVar3 == 0) {
              RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[10]->n);
              if (RVar3 == 0) {
                RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[0xb]->n);
                if (RVar3 == 0) {
                  uVar2 = ref_node_compact(ref_node,&local_c0,&local_c8);
                  if (uVar2 == 0) {
                    if (0 < ref_node->n) {
                      lVar8 = 0;
                      do {
                        local_e0 = ref_node->real[(long)local_c8[lVar8] * 0xf];
                        if (swap != 0) {
                          local_e0 = (REF_DBL)((ulong)local_e0 >> 0x38 |
                                               ((ulong)local_e0 & 0xff000000000000) >> 0x28 |
                                               ((ulong)local_e0 & 0xff0000000000) >> 0x18 |
                                               ((ulong)local_e0 & 0xff00000000) >> 8 |
                                               ((ulong)local_e0 & 0xff000000) << 8 |
                                               ((ulong)local_e0 & 0xff0000) << 0x18 |
                                               ((ulong)local_e0 & 0xff00) << 0x28 |
                                              (long)local_e0 << 0x38);
                        }
                        sVar5 = fwrite(&local_e0,8,1,__s);
                        if (sVar5 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x648,"ref_export_bin_ugrid","x",1,sVar5);
                          return 1;
                        }
                        local_e0 = ref_node->real[(long)local_c8[lVar8] * 0xf + 1];
                        if (swap != 0) {
                          local_e0 = (REF_DBL)((ulong)local_e0 >> 0x38 |
                                               ((ulong)local_e0 & 0xff000000000000) >> 0x28 |
                                               ((ulong)local_e0 & 0xff0000000000) >> 0x18 |
                                               ((ulong)local_e0 & 0xff00000000) >> 8 |
                                               ((ulong)local_e0 & 0xff000000) << 8 |
                                               ((ulong)local_e0 & 0xff0000) << 0x18 |
                                               ((ulong)local_e0 & 0xff00) << 0x28 |
                                              (long)local_e0 << 0x38);
                        }
                        sVar5 = fwrite(&local_e0,8,1,__s);
                        if (sVar5 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x64b,"ref_export_bin_ugrid","y",1,sVar5);
                          return 1;
                        }
                        local_e0 = ref_node->real[(long)local_c8[lVar8] * 0xf + 2];
                        if (swap != 0) {
                          local_e0 = (REF_DBL)((ulong)local_e0 >> 0x38 |
                                               ((ulong)local_e0 & 0xff000000000000) >> 0x28 |
                                               ((ulong)local_e0 & 0xff0000000000) >> 0x18 |
                                               ((ulong)local_e0 & 0xff00000000) >> 8 |
                                               ((ulong)local_e0 & 0xff000000) << 8 |
                                               ((ulong)local_e0 & 0xff0000) << 0x18 |
                                               ((ulong)local_e0 & 0xff00) << 0x28 |
                                              (long)local_e0 << 0x38);
                        }
                        sVar5 = fwrite(&local_e0,8,1,__s);
                        if (sVar5 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x64e,"ref_export_bin_ugrid","z",1,sVar5);
                          return 1;
                        }
                        lVar8 = lVar8 + 1;
                      } while (lVar8 < ref_node->n);
                    }
                    ref_export_faceid_range(ref_grid,(REF_INT *)&local_ac,&local_b0);
                    local_f0 = (ulong)local_ac;
                    if ((int)local_ac <= local_b0) {
                      pRVar9 = ref_grid->cell[3];
                      uVar2 = pRVar9->node_per;
                      local_b8 = (long)(int)uVar2;
                      local_d8 = local_f0;
                      local_d0 = pRVar9;
                      do {
                        if (0 < pRVar9->max) {
                          RVar6 = 0;
                          do {
                            RVar3 = ref_cell_nodes(pRVar9,RVar6,local_a8);
                            if ((RVar3 == 0) &&
                               (local_a8[local_b8] == (int)local_d8 && 0 < (int)local_b8)) {
                              uVar10 = 0;
                              do {
                                iVar1 = local_c0[local_a8[uVar10]];
                                local_a8[uVar10] = iVar1 + 1;
                                RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,iVar1 + 1);
                                if (RVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                         ,0x65a,"ref_export_bin_ugrid",1,"c2n");
                                  return 1;
                                }
                                uVar10 = uVar10 + 1;
                              } while (uVar2 != uVar10);
                            }
                            RVar6 = RVar6 + 1;
                            pRVar9 = local_d0;
                          } while (RVar6 < local_d0->max);
                        }
                        iVar1 = (int)local_d8;
                        local_d8 = (ulong)(iVar1 + 1);
                      } while (iVar1 != local_b0);
                    }
                    if ((int)local_ac <= local_b0) {
                      pRVar9 = ref_grid->cell[6];
                      uVar2 = pRVar9->node_per;
                      local_b8 = (long)(int)uVar2;
                      local_d8 = local_f0;
                      local_d0 = pRVar9;
                      do {
                        if (0 < pRVar9->max) {
                          RVar6 = 0;
                          do {
                            RVar3 = ref_cell_nodes(pRVar9,RVar6,local_a8);
                            if ((RVar3 == 0) &&
                               (local_a8[local_b8] == (int)local_d8 && 0 < (int)local_b8)) {
                              uVar10 = 0;
                              do {
                                iVar1 = local_c0[local_a8[uVar10]];
                                local_a8[uVar10] = iVar1 + 1;
                                RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,iVar1 + 1);
                                if (RVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                         ,0x667,"ref_export_bin_ugrid",1,"c2n");
                                  return 1;
                                }
                                uVar10 = uVar10 + 1;
                              } while (uVar2 != uVar10);
                            }
                            RVar6 = RVar6 + 1;
                            pRVar9 = local_d0;
                          } while (RVar6 < local_d0->max);
                        }
                        iVar1 = (int)local_d8;
                        local_d8 = (ulong)(iVar1 + 1);
                      } while (iVar1 != local_b0);
                    }
                    if ((int)local_ac <= local_b0) {
                      pRVar9 = ref_grid->cell[3];
                      iVar1 = pRVar9->node_per;
                      RVar3 = 0;
                      local_f8 = local_f0;
                      do {
                        iVar7 = (int)local_f8;
                        if (0 < pRVar9->max) {
                          RVar6 = 0;
                          do {
                            RVar4 = ref_cell_nodes(pRVar9,RVar6,local_a8);
                            if ((RVar4 == 0) && (local_a8[iVar1] == iVar7)) {
                              RVar4 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,local_a8[3]);
                              if (RVar4 != 0) {
                                RVar3 = 1;
                                local_d0 = (REF_CELL)CONCAT44(local_d0._4_4_,RVar4);
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x672,"ref_export_bin_ugrid",1,"c2n");
                                RVar4 = (int)local_d0;
                              }
                              if (RVar4 != 0) {
                                return RVar3;
                              }
                            }
                            RVar6 = RVar6 + 1;
                          } while (RVar6 < pRVar9->max);
                        }
                        local_f8 = (ulong)(iVar7 + 1);
                      } while (iVar7 != local_b0);
                    }
                    if ((int)local_ac <= local_b0) {
                      pRVar9 = ref_grid->cell[6];
                      iVar1 = pRVar9->node_per;
                      do {
                        iVar7 = (int)local_f0;
                        if (0 < pRVar9->max) {
                          RVar6 = 0;
                          do {
                            RVar3 = ref_cell_nodes(pRVar9,RVar6,local_a8);
                            if (((RVar3 == 0) && (local_a8[iVar1] == iVar7)) &&
                               (RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,local_98),
                               RVar3 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0x67c,"ref_export_bin_ugrid",1,"c2n");
                              return 1;
                            }
                            RVar6 = RVar6 + 1;
                          } while (RVar6 < pRVar9->max);
                        }
                        local_f0 = (ulong)(iVar7 + 1);
                      } while (iVar7 != local_b0);
                    }
                    local_d0 = (REF_CELL)ref_grid->cell;
                    ppRVar11 = ref_grid->cell + 8;
                    local_f0 = 8;
                    do {
                      pRVar9 = *ppRVar11;
                      if (0 < pRVar9->max) {
                        uVar2 = pRVar9->node_per;
                        RVar6 = 0;
                        do {
                          RVar3 = ref_cell_nodes(pRVar9,RVar6,local_a8);
                          if (RVar3 == 0 && 0 < (int)uVar2) {
                            uVar10 = 0;
                            do {
                              iVar1 = local_c0[local_a8[uVar10]];
                              local_a8[uVar10] = iVar1 + 1;
                              RVar3 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,iVar1 + 1);
                              if (RVar3 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x686,"ref_export_bin_ugrid",1,"c2n");
                                return 1;
                              }
                              uVar10 = uVar10 + 1;
                            } while (uVar2 != uVar10);
                          }
                          RVar6 = RVar6 + 1;
                        } while (RVar6 < pRVar9->max);
                      }
                      ppRVar11 = (REF_CELL *)((long)local_d0 + (local_f0 + 1) * 8);
                      local_f0 = local_f0 + 1;
                    } while (local_f0 != 0x10);
                    if (local_c8 != (REF_INT *)0x0) {
                      free(local_c8);
                    }
                    if (local_c0 != (REF_INT *)0x0) {
                      free(local_c0);
                    }
                    fclose(__s);
                    uVar2 = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x643,"ref_export_bin_ugrid",(ulong)uVar2,"compact");
                  }
                }
                else {
                  uVar2 = 1;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x641,"ref_export_bin_ugrid",1,"nhex");
                }
              }
              else {
                uVar2 = 1;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x63e,"ref_export_bin_ugrid",1,"npri");
              }
            }
            else {
              uVar2 = 1;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x63b,"ref_export_bin_ugrid",1,"npyr");
            }
          }
          else {
            uVar2 = 1;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x638,"ref_export_bin_ugrid",1,"ntet");
          }
        }
        else {
          uVar2 = 1;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x635,"ref_export_bin_ugrid",1,"nqua");
        }
      }
      else {
        uVar2 = 1;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x632,"ref_export_bin_ugrid",1,"ntri");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x62f,"ref_export_bin_ugrid",(ulong)uVar2,"nnode");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_DBL swapped_dbl;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_export_bin_ugrid_int(file, swap, fat, ref_node_n(ref_node)), "nnode");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tri(ref_grid))),
      "ntri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_qua(ref_grid))),
      "nqua");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tet(ref_grid))),
      "ntet");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pyr(ref_grid))),
      "npyr");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pri(ref_grid))),
      "npri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_hex(ref_grid))),
      "nhex");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    swapped_dbl = ref_node_xyz(ref_node, 0, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
    swapped_dbl = ref_node_xyz(ref_node, 1, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
    swapped_dbl = ref_node_xyz(ref_node, 2, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
  }

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[3]), "c2n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[4]), "c2n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++) {
        nodes[node] = o2n[nodes[node]] + 1;
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
      }
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}